

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

size_type __thiscall
slang::SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::calculateGrowth
          (SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *this,size_type newSize)

{
  ulong in_RSI;
  long in_RDI;
  size_type doubled;
  size_type max;
  size_type local_8;
  
  local_8 = max_size((SmallVectorBase<slang::ast::SequenceConcatExpr::Element> *)0x9dea6d);
  if ((*(ulong *)(in_RDI + 0x10) <= local_8 - *(long *)(in_RDI + 0x10)) &&
     (local_8 = *(long *)(in_RDI + 0x10) << 1, local_8 < in_RSI)) {
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

constexpr size_type calculateGrowth(size_type newSize) const {
        const auto max = max_size();
        if (cap > max - cap)
            return max;

        const size_type doubled = cap * 2;
        if (doubled < newSize)
            return newSize;

        return doubled;
    }